

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O2

void Of_ManComputeForwardDircon1(Of_Man_t *p)

{
  ulong uVar1;
  Of_Obj_t *pOVar2;
  int iVar3;
  Gia_Obj_t *pObj;
  long lVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  
  lVar5 = 0xc;
  lVar4 = 0;
  lVar7 = 0;
  while( true ) {
    if (p->pGia->nObjs <= lVar7) {
      return;
    }
    pObj = Gia_ManObj(p->pGia,(int)lVar7);
    if (pObj == (Gia_Obj_t *)0x0) break;
    uVar1 = *(ulong *)pObj;
    uVar6 = (uint)uVar1;
    if ((~uVar6 & 0x1fffffff) != 0 && -1 < (int)uVar6) {
      iVar3 = Gia_ObjIsBuf(pObj);
      if (iVar3 == 0) {
        Of_ManComputeForwardDirconObj(p,(int)lVar7);
      }
      else {
        pOVar2 = p->pObjs;
        *(undefined4 *)((long)pOVar2 + lVar5 + -4) =
             *(undefined4 *)
              ((long)&pOVar2->Delay1 + ((long)((uVar1 & 0x1fffffff) * -0x100000000 + lVar4) >> 0x1b)
              );
        *(undefined4 *)((long)&pOVar2->iCutH + lVar5) =
             *(undefined4 *)
              ((long)&pOVar2->Delay2 +
              ((long)((*(ulong *)pObj & 0x1fffffff) * -0x100000000 + lVar4) >> 0x1b));
      }
    }
    lVar7 = lVar7 + 1;
    lVar4 = lVar4 + 0x100000000;
    lVar5 = lVar5 + 0x20;
  }
  return;
}

Assistant:

void Of_ManComputeForwardDircon1( Of_Man_t * p )
{
    Gia_Obj_t * pObj; int i;
    Gia_ManForEachAnd( p->pGia, pObj, i )
        if ( Gia_ObjIsBuf(pObj) )
        {
            Of_ObjSetDelay1( p, i, Of_ObjDelay1(p, Gia_ObjFaninId0(pObj, i)) );
            Of_ObjSetDelay2( p, i, Of_ObjDelay2(p, Gia_ObjFaninId0(pObj, i)) );
        }
        else
            Of_ManComputeForwardDirconObj( p, i );
}